

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

void Ins_MDRP(TT_ExecContext exc,FT_Long *args)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  FT_Vector *pFVar4;
  uint uVar5;
  FT_Vector *pFVar6;
  FT_F26Dot6 FVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  FT_Pos FVar12;
  FT_Pos FVar13;
  FT_UShort FVar14;
  long lVar15;
  
  FVar14 = (FT_UShort)*args;
  uVar5 = (uint)*args;
  if (((uint)(exc->zp1).n_points <= (uVar5 & 0xffff)) ||
     (uVar2 = (exc->GS).rp0, (exc->zp0).n_points <= uVar2)) {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    goto LAB_00258138;
  }
  if (((exc->GS).gep0 == 0) || ((exc->GS).gep1 == 0)) {
    pFVar6 = (exc->zp0).org;
    pFVar4 = (exc->zp1).org;
    uVar10 = (ulong)((uVar5 & 0xffff) << 4);
    FVar13 = *(long *)((long)&pFVar4->x + uVar10) - pFVar6[uVar2].x;
    FVar12 = *(long *)((long)&pFVar4->y + uVar10) - pFVar6[uVar2].y;
LAB_00258021:
    FVar7 = (*exc->func_dualproj)(exc,FVar13,FVar12);
  }
  else {
    plVar11 = (long *)((long)&((exc->zp1).orus)->x + (ulong)((uVar5 & 0xffff) << 4));
    pFVar6 = (exc->zp0).orus + uVar2;
    lVar8 = (exc->metrics).x_scale;
    lVar15 = (exc->metrics).y_scale;
    if (lVar8 != lVar15) {
      lVar8 = (long)(int)lVar8 * (long)((int)*plVar11 - (int)pFVar6->x);
      FVar13 = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
      lVar8 = (long)(int)lVar15 * (long)((int)plVar11[1] - (int)pFVar6->y);
      FVar12 = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
      goto LAB_00258021;
    }
    FVar7 = (*exc->func_dualproj)(exc,*plVar11 - pFVar6->x,plVar11[1] - pFVar6->y);
    lVar8 = (long)(int)FVar7 * (long)(int)(exc->metrics).x_scale;
    FVar7 = (FT_F26Dot6)(int)((ulong)(lVar8 + (lVar8 >> 0x3f) + 0x8000) >> 0x10);
  }
  lVar8 = (exc->GS).single_width_cutin;
  lVar15 = FVar7;
  if (((0 < lVar8) &&
      (lVar3 = (exc->GS).single_width_value, lVar3 - lVar8 < FVar7 && FVar7 < lVar3 + lVar8)) &&
     (lVar15 = -lVar3, -1 < FVar7)) {
    lVar15 = lVar3;
  }
  bVar1 = exc->opcode;
  if ((bVar1 & 4) == 0) {
    lVar8 = (exc->tt_metrics).compensations[bVar1 & 3];
    if (lVar15 < 0) {
      uVar10 = lVar15 - lVar8;
      uVar10 = (long)uVar10 >> 0x3f & uVar10;
    }
    else {
      uVar9 = lVar8 + lVar15;
      uVar10 = 0;
      if (0 < (long)uVar9) {
        uVar10 = uVar9;
      }
    }
  }
  else {
    uVar10 = (*exc->func_round)(exc,lVar15,bVar1 & 3);
  }
  if ((exc->opcode & 8) != 0) {
    uVar9 = (exc->GS).minimum_distance;
    if (lVar15 < 0) {
      if (SBORROW8(uVar10,-uVar9) == (long)(uVar10 + uVar9) < 0) {
        uVar10 = -uVar9;
      }
    }
    else if ((long)uVar10 <= (long)uVar9) {
      uVar10 = uVar9;
    }
  }
  pFVar6 = (exc->zp0).cur;
  pFVar4 = (exc->zp1).cur;
  uVar9 = (ulong)((uVar5 & 0xffff) << 4);
  uVar2 = (exc->GS).rp0;
  FVar7 = (*exc->func_project)
                    (exc,*(long *)((long)&pFVar4->x + uVar9) - pFVar6[uVar2].x,
                     *(long *)((long)&pFVar4->y + uVar9) - pFVar6[uVar2].y);
  (*exc->func_move)(exc,&exc->zp1,FVar14,uVar10 - FVar7);
LAB_00258138:
  (exc->GS).rp1 = (exc->GS).rp0;
  (exc->GS).rp2 = FVar14;
  if ((exc->opcode & 0x10) != 0) {
    (exc->GS).rp0 = FVar14;
  }
  return;
}

Assistant:

static void
  Ins_MDRP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point = 0;
    FT_F26Dot6  org_dist, distance;


    point = (FT_UShort)args[0];

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    /* XXX: Is there some undocumented feature while in the */
    /*      twilight zone?                                  */

    /* XXX: UNDOCUMENTED: twilight zone special case */

    if ( exc->GS.gep0 == 0 || exc->GS.gep1 == 0 )
    {
      FT_Vector*  vec1 = &exc->zp1.org[point];
      FT_Vector*  vec2 = &exc->zp0.org[exc->GS.rp0];


      org_dist = DUALPROJ( vec1, vec2 );
    }
    else
    {
      FT_Vector*  vec1 = &exc->zp1.orus[point];
      FT_Vector*  vec2 = &exc->zp0.orus[exc->GS.rp0];


      if ( exc->metrics.x_scale == exc->metrics.y_scale )
      {
        /* this should be faster */
        org_dist = DUALPROJ( vec1, vec2 );
        org_dist = FT_MulFix( org_dist, exc->metrics.x_scale );
      }
      else
      {
        FT_Vector  vec;


        vec.x = FT_MulFix( SUB_LONG( vec1->x, vec2->x ),
                           exc->metrics.x_scale );
        vec.y = FT_MulFix( SUB_LONG( vec1->y, vec2->y ),
                           exc->metrics.y_scale );

        org_dist = FAST_DUALPROJ( &vec );
      }
    }

    /* single width cut-in test */

    /* |org_dist - single_width_value| < single_width_cutin */
    if ( exc->GS.single_width_cutin > 0          &&
         org_dist < exc->GS.single_width_value +
                      exc->GS.single_width_cutin &&
         org_dist > exc->GS.single_width_value -
                      exc->GS.single_width_cutin )
    {
      if ( org_dist >= 0 )
        org_dist = exc->GS.single_width_value;
      else
        org_dist = -exc->GS.single_width_value;
    }

    /* round flag */

    if ( ( exc->opcode & 4 ) != 0 )
    {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY &&
           exc->ignore_x_mode          &&
           exc->GS.freeVector.x != 0   )
        distance = Round_None( exc, org_dist, exc->opcode & 3 );
      else
#endif
        distance = exc->func_round( exc, org_dist, exc->opcode & 3 );
    }
    else
      distance = Round_None( exc, org_dist, exc->opcode & 3 );

    /* minimum distance flag */

    if ( ( exc->opcode & 8 ) != 0 )
    {
      FT_F26Dot6  minimum_distance = exc->GS.minimum_distance;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      if ( SUBPIXEL_HINTING_INFINALITY                        &&
           exc->ignore_x_mode                                 &&
           exc->GS.freeVector.x != 0                          &&
           !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
        minimum_distance = 0;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      if ( org_dist >= 0 )
      {
        if ( distance < minimum_distance )
          distance = minimum_distance;
      }
      else
      {
        if ( distance > NEG_LONG( minimum_distance ) )
          distance = NEG_LONG( minimum_distance );
      }
    }

    /* now move the point */

    org_dist = PROJECT( exc->zp1.cur + point, exc->zp0.cur + exc->GS.rp0 );

    exc->func_move( exc, &exc->zp1, point, SUB_LONG( distance, org_dist ) );

  Fail:
    exc->GS.rp1 = exc->GS.rp0;
    exc->GS.rp2 = point;

    if ( ( exc->opcode & 16 ) != 0 )
      exc->GS.rp0 = point;
  }